

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setModel
          (InverseKinematics *this,Model *model,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::setModel(const iDynTree::Model &model,
                                     const std::vector<std::string> &consideredJoints)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->setModel(model, consideredJoints);
#else
        return missingIpoptErrorReport();
#endif
    }